

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_copy_to_file.cpp
# Opt level: O2

unique_ptr<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>,_true>
__thiscall
duckdb::PhysicalCopyToFile::CreateFileState
          (PhysicalCopyToFile *this,ClientContext *context,GlobalSinkState *sink,
          StorageLockKey *global_lock)

{
  StorageLockKey *pSVar1;
  _Prime_rehash_policy *this_00;
  element_type *offset;
  CopyFunctionReturnType return_type;
  code *pcVar2;
  FileSystem *fs;
  type pFVar3;
  type pGVar4;
  CopyToFileInfo *pCVar5;
  type pCVar6;
  StorageLockKey *in_R8;
  bool bVar7;
  optional_ptr<duckdb::CopyToFileInfo,_true> written_file_info;
  string output_path;
  
  LOCK();
  pSVar1 = global_lock + 5;
  offset = (pSVar1->internals).internal.
           super___shared_ptr<duckdb::StorageLockInternals,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (pSVar1->internals).internal.
  super___shared_ptr<duckdb::StorageLockInternals,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       ((long)&(((pSVar1->internals).internal.
                 super___shared_ptr<duckdb::StorageLockInternals,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                )->super_enable_shared_from_this<duckdb::StorageLockInternals>).__weak_this_.
               internal + 1);
  UNLOCK();
  fs = FileSystem::GetFileSystem((ClientContext *)sink);
  FilenamePattern::CreateFilename
            (&output_path,(FilenamePattern *)&context[1].config.preserve_identifier_case,fs,
             (string *)&context[1].config.profiler_settings._M_h._M_rehash_policy._M_next_resize,
             (string *)&context[1].config.partitioned_write_flush_threshold,(idx_t)offset);
  written_file_info.ptr = (CopyToFileInfo *)0x0;
  return_type = *(CopyFunctionReturnType *)((long)&context[1].config.display_create_func + 1);
  if (return_type == CHANGED_ROWS) {
    bVar7 = true;
  }
  else {
    written_file_info =
         CopyToFunctionGlobalState::AddFile
                   ((CopyToFunctionGlobalState *)global_lock,in_R8,&output_path,return_type);
    bVar7 = written_file_info.ptr == (CopyToFileInfo *)0x0;
  }
  pcVar2 = *(code **)&(context->config).force_no_cross_product;
  this_00 = &context[1].config.profiler_settings._M_h._M_rehash_policy;
  pFVar3 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
           operator*((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
                      *)this_00);
  (*pcVar2)(this,sink,pFVar3,&output_path);
  if (!bVar7) {
    pcVar2 = (code *)(context->config).perfect_ht_threshold;
    pFVar3 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
             operator*((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
                        *)this_00);
    pGVar4 = unique_ptr<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>,_true>
             ::operator*((unique_ptr<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>,_true>
                          *)this);
    pCVar5 = optional_ptr<duckdb::CopyToFileInfo,_true>::operator->(&written_file_info);
    pCVar6 = unique_ptr<duckdb::CopyFunctionFileStatistics,_std::default_delete<duckdb::CopyFunctionFileStatistics>,_true>
             ::operator*(&pCVar5->file_stats);
    (*pcVar2)(sink,pFVar3,pGVar4,pCVar6);
  }
  ::std::__cxx11::string::~string((string *)&output_path);
  return (unique_ptr<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>_>)
         (unique_ptr<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>_>)
         this;
}

Assistant:

unique_ptr<GlobalFunctionData> PhysicalCopyToFile::CreateFileState(ClientContext &context, GlobalSinkState &sink,
                                                                   StorageLockKey &global_lock) const {
	auto &g = sink.Cast<CopyToFunctionGlobalState>();
	idx_t this_file_offset = g.last_file_offset++;
	auto &fs = FileSystem::GetFileSystem(context);
	string output_path(filename_pattern.CreateFilename(fs, file_path, file_extension, this_file_offset));
	optional_ptr<CopyToFileInfo> written_file_info;
	if (return_type != CopyFunctionReturnType::CHANGED_ROWS) {
		written_file_info = g.AddFile(global_lock, output_path, return_type);
	}
	auto result = function.copy_to_initialize_global(context, *bind_data, output_path);
	if (written_file_info) {
		function.copy_to_get_written_statistics(context, *bind_data, *result, *written_file_info->file_stats);
	}
	return result;
}